

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
libcellml::Validator::ValidatorImpl::validateImportSource
          (ValidatorImpl *this,ImportSourcePtr *importSource,string *importName,string *importType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IssueImpl *pIVar2;
  bool bVar3;
  long *plVar4;
  undefined8 *puVar5;
  long lVar6;
  element_type *peVar7;
  size_type *psVar8;
  ulong *puVar9;
  ulong uVar10;
  undefined8 uVar11;
  IssuePtr issue_1;
  IssuePtr issue;
  string url;
  string local_148;
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  IssuePtr local_e8;
  element_type local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ValidatorImpl *local_a8;
  IssuePtr local_a0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8 = this;
  ImportSource::url_abi_cxx11_
            (&local_70,
             (importSource->super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr);
  Entity::id_abi_cxx11_
            (&local_148,
             &((importSource->
               super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Entity);
  bVar3 = isValidXmlName(&local_148);
  paVar1 = &local_148.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((local_a0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,XML_ID_ATTRIBUTE);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((((local_a0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,importSource);
    pIVar2 = (local_a0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    std::operator+(&local_50,"Import of ",importType);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_d8;
    peVar7 = (element_type *)(plVar4 + 2);
    if ((element_type *)*plVar4 == peVar7) {
      local_d8._vptr_Issue = peVar7->_vptr_Issue;
      local_d8.mPimpl = (IssueImpl *)plVar4[3];
    }
    else {
      local_d8._vptr_Issue = peVar7->_vptr_Issue;
      local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*plVar4;
    }
    local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
    *plVar4 = (long)peVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e8,(ulong)(importName->_M_dataplus)._M_p);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c8.field_2._M_allocated_capacity = *psVar8;
      local_c8.field_2._8_8_ = plVar4[3];
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar8;
      local_c8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_c8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
    puVar9 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar9) {
      local_f8 = *puVar9;
      lStack_f0 = plVar4[3];
      local_108 = &local_f8;
    }
    else {
      local_f8 = *puVar9;
      local_108 = (ulong *)*plVar4;
    }
    local_100 = plVar4[1];
    *plVar4 = (long)puVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Entity::id_abi_cxx11_
              (&local_90,
               &((importSource->
                 super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_Entity);
    uVar10 = 0xf;
    if (local_108 != &local_f8) {
      uVar10 = local_f8;
    }
    if (uVar10 < local_90._M_string_length + local_100) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar11 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_90._M_string_length + local_100) goto LAB_00269b43;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_108);
    }
    else {
LAB_00269b43:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_90._M_dataplus._M_p);
    }
    local_128 = &local_118;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_118 = *plVar4;
      uStack_110 = puVar5[3];
    }
    else {
      local_118 = *plVar4;
      local_128 = (long *)*puVar5;
    }
    local_120 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148.field_2._8_8_ = plVar4[3];
      local_148._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_148._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar2,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        &local_d8) {
      operator_delete(local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(long)local_d8._vptr_Issue + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Logger::LoggerImpl::addIssue(&local_a8->super_LoggerImpl,&local_a0);
    if (local_a0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (local_70._M_string_length == 0) {
    Issue::IssueImpl::create();
    pIVar2 = (local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    std::operator+(&local_c8,"Import of ",importType);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
    puVar9 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar9) {
      local_f8 = *puVar9;
      lStack_f0 = plVar4[3];
      local_108 = &local_f8;
    }
    else {
      local_f8 = *puVar9;
      local_108 = (ulong *)*plVar4;
    }
    local_100 = plVar4[1];
    *plVar4 = (long)puVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_108,(ulong)(importName->_M_dataplus)._M_p);
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_118 = *plVar4;
      uStack_110 = puVar5[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar4;
      local_128 = (long *)*puVar5;
    }
    local_120 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148.field_2._8_8_ = plVar4[3];
      local_148._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_148._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar2,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((((local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,importSource);
    Issue::IssueImpl::setReferenceRule
              ((local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORT_HREF_LOCATOR);
    Logger::LoggerImpl::addIssue(&local_a8->super_LoggerImpl,&local_e8);
  }
  else {
    lVar6 = xmlParseURI(local_70._M_dataplus._M_p);
    if (lVar6 != 0) {
      xmlFreeURI(lVar6);
      goto LAB_0026a0e6;
    }
    Issue::IssueImpl::create();
    pIVar2 = (local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    std::operator+(&local_c8,"Import of ",importType);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
    puVar9 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar9) {
      local_f8 = *puVar9;
      lStack_f0 = plVar4[3];
      local_108 = &local_f8;
    }
    else {
      local_f8 = *puVar9;
      local_108 = (ulong *)*plVar4;
    }
    local_100 = plVar4[1];
    *plVar4 = (long)puVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_108,(ulong)(importName->_M_dataplus)._M_p);
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_118 = *plVar4;
      uStack_110 = puVar5[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar4;
      local_128 = (long *)*puVar5;
    }
    local_120 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148.field_2._8_8_ = plVar4[3];
      local_148._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_148._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar2,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((((local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,importSource);
    Issue::IssueImpl::setReferenceRule
              ((local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORT_HREF_LOCATOR);
    Logger::LoggerImpl::addIssue(&local_a8->super_LoggerImpl,&local_e8);
  }
  if (local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
LAB_0026a0e6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::validateImportSource(const ImportSourcePtr &importSource, const std::string &importName, const std::string &importType)
{
    std::string url = importSource->url();

    // Check for a valid identifier.
    if (!isValidXmlName(importSource->id())) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setDescription("Import of " + importType + " '" + importName + "' does not have a valid 'id' attribute, '" + importSource->id() + "'.");
        addIssue(issue);
    }

    if (url.empty()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Import of " + importType + " '" + importName + "' does not have a valid locator xlink:href attribute.");
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_HREF_LOCATOR);
        addIssue(issue);
    } else {
        xmlURIPtr uri = xmlParseURI(url.c_str());
        if (uri == nullptr) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Import of " + importType + " '" + importName + "' has an invalid URI in the xlink:href attribute.");
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_HREF_LOCATOR);
            addIssue(issue);

        } else {
            xmlFreeURI(uri);
        }
    }
}